

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffh2st(fitsfile *fptr,char **header,int *status)

{
  int iVar1;
  char *pcVar2;
  long nbytes;
  int nkeys;
  LONGLONG headstart;
  int local_34;
  LONGLONG local_30;
  
  if (0 < *status) {
    return *status;
  }
  iVar1 = ffghsp(fptr,&local_34,(int *)0x0,status);
  if (iVar1 < 1) {
    nbytes = (long)(local_34 / 0x24 + 1) * 0xb40;
    pcVar2 = (char *)calloc(nbytes + 1,1);
    *header = pcVar2;
    if (pcVar2 == (char *)0x0) {
      *status = 0x71;
      ffpmsg("failed to allocate memory to hold all the header keywords");
    }
    else {
      ffghadll(fptr,&local_30,(LONGLONG *)0x0,(LONGLONG *)0x0,status);
      ffmbyt(fptr,local_30,0,status);
      ffgbyt(fptr,nbytes,*header,status);
      (*header)[nbytes] = '\0';
    }
  }
  return *status;
}

Assistant:

int ffh2st(fitsfile *fptr,   /* I - FITS file pointer           */
           char **header,    /* O - returned header string      */
           int  *status)     /* IO - error status               */

/*
  read header keywords into a long string of chars.  This routine allocates
  memory for the string, so the calling routine must eventually free the
  memory when it is not needed any more.
*/
{
    int nkeys;
    long nrec;
    LONGLONG headstart;

    if (*status > 0)
        return(*status);

    /* get number of keywords in the header (doesn't include END) */
    if (ffghsp(fptr, &nkeys, NULL, status) > 0)
        return(*status);

    nrec = (nkeys / 36 + 1);

    /* allocate memory for all the keywords (multiple of 2880 bytes) */
    *header = (char *) calloc ( nrec * 2880 + 1, 1);
    if (!(*header))
    {
         *status = MEMORY_ALLOCATION;
         ffpmsg("failed to allocate memory to hold all the header keywords");
         return(*status);
    }

    ffghadll(fptr, &headstart, NULL, NULL, status); /* get header address */
    ffmbyt(fptr, headstart, REPORT_EOF, status);   /* move to header */
    ffgbyt(fptr, nrec * 2880, *header, status);     /* copy header */
    *(*header + (nrec * 2880)) = '\0';

    return(*status);
}